

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

void NULLCVector::ConstructVector(vector *vec,uint type,int reserved)

{
  uint uVar1;
  NULLCArray NVar2;
  
  vec->elemType = type;
  uVar1 = nullcIsPointer(type);
  vec->flags = uVar1;
  vec->size = 0;
  uVar1 = nullcGetTypeSize(type);
  vec->elemSize = uVar1;
  (vec->data).typeID = type;
  if (reserved == 0) {
    NVar2 = (NULLCArray)ZEXT412(0);
  }
  else {
    NVar2 = nullcAllocateArrayTyped(type,reserved);
  }
  (vec->data).ptr = NVar2.ptr;
  (vec->data).len = NVar2.len;
  return;
}

Assistant:

void ConstructVector(vector* vec, unsigned int type, int reserved)
	{
		vec->elemType = type;
		vec->flags = nullcIsPointer(type);
		vec->size = 0;
		vec->elemSize = nullcGetTypeSize(type);
		vec->data.typeID = type;
		if(reserved)
		{
			NULLCArray data = nullcAllocateArrayTyped(type, reserved);

			vec->data.ptr = data.ptr;
			vec->data.len = data.len;
		}else{
			vec->data.ptr = 0;
			vec->data.len = 0;
		}
	}